

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::ListType::Clear(ListType *this)

{
  ValueType *this_00;
  Dimension *this_01;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  ListType *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->type_ != (ValueType *)0x0)) &&
     (this_00 = this->type_, this_00 != (ValueType *)0x0)) {
    ValueType::~ValueType(this_00);
    operator_delete(this_00,0x20);
  }
  this->type_ = (ValueType *)0x0;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->length_ != (Dimension *)0x0)) &&
     (this_01 = this->length_, this_01 != (Dimension *)0x0)) {
    Dimension::~Dimension(this_01);
    operator_delete(this_01,0x20);
  }
  this->length_ = (Dimension *)0x0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ListType::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.ListType)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  if (GetArenaForAllocation() == nullptr && type_ != nullptr) {
    delete type_;
  }
  type_ = nullptr;
  if (GetArenaForAllocation() == nullptr && length_ != nullptr) {
    delete length_;
  }
  length_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}